

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Vector4f operator*(Matrix4f *m,Vector4f *v)

{
  float fVar1;
  float *pfVar2;
  Vector4f *in_RDX;
  float *pfVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  float fVar6;
  ulong extraout_XMM0_Qa;
  undefined8 uVar8;
  Vector4f VVar9;
  ulong uVar7;
  
  uVar8 = 0;
  Vector4f::Vector4f((Vector4f *)m,0.0,0.0,0.0,0.0);
  uVar7 = extraout_XMM0_Qa;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    lVar5 = 0;
    pfVar3 = v->m_elements;
    for (; lVar5 != 4; lVar5 = lVar5 + 1) {
      fVar6 = *pfVar3;
      pfVar2 = Vector4f::operator[](in_RDX,(int)lVar5);
      fVar1 = *pfVar2;
      pfVar2 = Vector4f::operator[]((Vector4f *)m,(int)lVar4);
      fVar6 = fVar6 * fVar1 + *pfVar2;
      uVar7 = (ulong)(uint)fVar6;
      *pfVar2 = fVar6;
      pfVar3 = pfVar3 + 4;
    }
    v = (Vector4f *)((long)v + 4);
  }
  VVar9.m_elements[2] = (float)(int)uVar8;
  VVar9.m_elements[3] = (float)(int)((ulong)uVar8 >> 0x20);
  VVar9.m_elements[0] = (float)(int)uVar7;
  VVar9.m_elements[1] = (float)(int)(uVar7 >> 0x20);
  return (Vector4f)VVar9.m_elements;
}

Assistant:

Vector4f operator * ( const Matrix4f& m, const Vector4f& v )
{
	Vector4f output( 0, 0, 0, 0 );

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}